

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

_Bool rf_is_model_animation_valid(rf_model model,rf_model_animation anim)

{
  long lVar1;
  bool bVar2;
  
  if (model.bone_count != anim.bone_count) {
    return false;
  }
  if (0 < model.bone_count) {
    lVar1 = 0x20;
    do {
      model.bone_count = model.bone_count + -1;
      bVar2 = *(long *)((model.bones)->name + lVar1) == *(long *)((anim.bones)->name + lVar1);
      if (!bVar2) {
        return bVar2;
      }
      lVar1 = lVar1 + 0x28;
    } while (model.bone_count != 0);
    return bVar2;
  }
  return true;
}

Assistant:

RF_API bool rf_is_model_animation_valid(rf_model model, rf_model_animation anim)
{
    int result = true;

    if (model.bone_count != anim.bone_count) result = false;
    else
    {
        for (rf_int i = 0; i < model.bone_count; i++)
        {
            if (model.bones[i].parent != anim.bones[i].parent) { result = false; break; }
        }
    }

    return result;
}